

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O0

void lower_named_interface_blocks(void *mem_ctx,gl_linked_shader *shader)

{
  undefined1 local_60 [8];
  flatten_named_interface_blocks_declarations v_decl;
  gl_linked_shader *shader_local;
  void *mem_ctx_local;
  
  v_decl.interface_namespace = (hash_table *)shader;
  anon_unknown.dwarf_4d997::flatten_named_interface_blocks_declarations::
  flatten_named_interface_blocks_declarations
            ((flatten_named_interface_blocks_declarations *)local_60,mem_ctx);
  anon_unknown.dwarf_4d997::flatten_named_interface_blocks_declarations::run
            ((flatten_named_interface_blocks_declarations *)local_60,
             *(exec_list **)&(v_decl.interface_namespace)->size);
  return;
}

Assistant:

void
lower_named_interface_blocks(void *mem_ctx, gl_linked_shader *shader)
{
   flatten_named_interface_blocks_declarations v_decl(mem_ctx);
   v_decl.run(shader->ir);
}